

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCss::AnimationRule>::emplace<QCss::AnimationRule_const&>
          (QMovableArrayOps<QCss::AnimationRule> *this,qsizetype i,AnimationRule *args)

{
  qsizetype *pqVar1;
  AnimationRule **ppAVar2;
  AnimationRule *pAVar3;
  Data *pDVar4;
  AnimationRule *pAVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
           super_QArrayDataPointer<QCss::AnimationRule>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_005eb389:
    pDVar6 = (args->animName).d.d;
    pcVar7 = (args->animName).d.ptr;
    qVar8 = (args->animName).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    local_48.d = (args->ruleSets).d.d;
    local_48.ptr = (args->ruleSets).d.ptr;
    local_48.size = (args->ruleSets).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar10 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
             super_QArrayDataPointer<QCss::AnimationRule>.size != 0;
    QArrayDataPointer<QCss::AnimationRule>::detachAndGrow
              ((QArrayDataPointer<QCss::AnimationRule> *)this,(uint)(i == 0 && bVar10),1,
               (AnimationRule **)0x0,(QArrayDataPointer<QCss::AnimationRule> *)0x0);
    pAVar5 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
             super_QArrayDataPointer<QCss::AnimationRule>.ptr;
    if (i == 0 && bVar10) {
      pAVar5[-1].animName.d.d = pDVar6;
      pAVar5[-1].animName.d.ptr = pcVar7;
      pAVar5[-1].animName.d.size = qVar8;
      pAVar5[-1].ruleSets.d.d = local_48.d;
      pAVar5[-1].ruleSets.d.ptr = local_48.ptr;
      pAVar5[-1].ruleSets.d.size = local_48.size;
      (this->super_QGenericArrayOps<QCss::AnimationRule>).
      super_QArrayDataPointer<QCss::AnimationRule>.ptr = pAVar5 + -1;
    }
    else {
      pAVar3 = pAVar5 + i;
      memmove(pAVar3 + 1,pAVar5 + i,
              ((this->super_QGenericArrayOps<QCss::AnimationRule>).
               super_QArrayDataPointer<QCss::AnimationRule>.size - i) * 0x30);
      (pAVar3->animName).d.d = pDVar6;
      (pAVar3->animName).d.ptr = pcVar7;
      (pAVar3->animName).d.size = qVar8;
      (pAVar3->ruleSets).d.d = local_48.d;
      (pAVar3->ruleSets).d.ptr = local_48.ptr;
      (pAVar3->ruleSets).d.size = local_48.size;
    }
    local_48.size = 0;
    local_48.ptr = (AnimationRuleSet *)0x0;
    local_48.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
              super_QArrayDataPointer<QCss::AnimationRule>.size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet>::~QArrayDataPointer(&local_48);
  }
  else {
    if (((this->super_QGenericArrayOps<QCss::AnimationRule>).
         super_QArrayDataPointer<QCss::AnimationRule>.size == i) &&
       (pAVar5 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
                 super_QArrayDataPointer<QCss::AnimationRule>.ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pAVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pDVar6 = (args->animName).d.d;
      pAVar5[i].animName.d.d = pDVar6;
      pAVar5[i].animName.d.ptr = (args->animName).d.ptr;
      pAVar5[i].animName.d.size = (args->animName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar9 = (args->ruleSets).d.d;
      pAVar5[i].ruleSets.d.d = pDVar9;
      pAVar5[i].ruleSets.d.ptr = (args->ruleSets).d.ptr;
      pAVar5[i].ruleSets.d.size = (args->ruleSets).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if ((i != 0) ||
         (pAVar5 = (this->super_QGenericArrayOps<QCss::AnimationRule>).
                   super_QArrayDataPointer<QCss::AnimationRule>.ptr,
         (AnimationRule *)
         ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pAVar5))
      goto LAB_005eb389;
      pDVar6 = (args->animName).d.d;
      pAVar5[-1].animName.d.d = pDVar6;
      pAVar5[-1].animName.d.ptr = (args->animName).d.ptr;
      pAVar5[-1].animName.d.size = (args->animName).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar9 = (args->ruleSets).d.d;
      pAVar5[-1].ruleSets.d.d = pDVar9;
      pAVar5[-1].ruleSets.d.ptr = (args->ruleSets).d.ptr;
      pAVar5[-1].ruleSets.d.size = (args->ruleSets).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppAVar2 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
                 super_QArrayDataPointer<QCss::AnimationRule>.ptr;
      *ppAVar2 = *ppAVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::AnimationRule>).
              super_QArrayDataPointer<QCss::AnimationRule>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }